

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O3

void fillAes1Rx4<false>(void *state,size_t outputSize,void *buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*pauVar5) [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar4 = _DAT_001323e0;
  auVar3 = _DAT_001323d0;
  auVar2 = _DAT_001323c0;
  auVar1 = _DAT_001323b0;
  auVar9 = *state;
  auVar8 = *(undefined1 (*) [16])((long)state + 0x10);
  auVar7 = *(undefined1 (*) [16])((long)state + 0x20);
  auVar6 = *(undefined1 (*) [16])((long)state + 0x30);
  if (0 < (long)outputSize) {
    pauVar5 = (undefined1 (*) [16])(outputSize + (long)buffer);
    do {
      auVar6 = aesenc(auVar6,auVar4);
      auVar7 = aesdec(auVar7,auVar3);
      auVar8 = aesenc(auVar8,auVar2);
      auVar9 = aesdec(auVar9,auVar1);
      *(undefined1 (*) [16])buffer = auVar9;
      *(undefined1 (*) [16])((long)buffer + 0x10) = auVar8;
      *(undefined1 (*) [16])((long)buffer + 0x20) = auVar7;
      *(undefined1 (*) [16])((long)buffer + 0x30) = auVar6;
      buffer = (void *)((long)buffer + 0x40);
    } while (buffer < pauVar5);
  }
  *(undefined1 (*) [16])state = auVar9;
  *(undefined1 (*) [16])((long)state + 0x10) = auVar8;
  *(undefined1 (*) [16])((long)state + 0x20) = auVar7;
  *(undefined1 (*) [16])((long)state + 0x30) = auVar6;
  return;
}

Assistant:

void fillAes1Rx4(void *state, size_t outputSize, void *buffer) {
	assert(outputSize % 64 == 0);
	const uint8_t* outptr = (uint8_t*)buffer;
	const uint8_t* outputEnd = outptr + outputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 key0, key1, key2, key3;

	key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	state0 = rx_load_vec_i128((rx_vec_i128*)state + 0);
	state1 = rx_load_vec_i128((rx_vec_i128*)state + 1);
	state2 = rx_load_vec_i128((rx_vec_i128*)state + 2);
	state3 = rx_load_vec_i128((rx_vec_i128*)state + 3);

	while (outptr < outputEnd) {
		state0 = aesdec<softAes>(state0, key0);
		state1 = aesenc<softAes>(state1, key1);
		state2 = aesdec<softAes>(state2, key2);
		state3 = aesenc<softAes>(state3, key3);

		rx_store_vec_i128((rx_vec_i128*)outptr + 0, state0);
		rx_store_vec_i128((rx_vec_i128*)outptr + 1, state1);
		rx_store_vec_i128((rx_vec_i128*)outptr + 2, state2);
		rx_store_vec_i128((rx_vec_i128*)outptr + 3, state3);

		outptr += 64;
	}

	rx_store_vec_i128((rx_vec_i128*)state + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)state + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)state + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)state + 3, state3);
}